

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  __ssize_t _Var1;
  char *local_38;
  char *line_buf;
  size_t line_size;
  FILE *file2;
  FILE *file1;
  char *dest_local;
  char *source_local;
  
  file1 = (FILE *)src;
  dest_local = (char *)dst;
  file2 = (FILE *)fopen((char *)dst,"r");
  if ((FILE *)file2 == (FILE *)0x0) {
    perror("file1");
    exit(1);
  }
  line_size = (size_t)fopen((char *)file1,"wa");
  if ((FILE *)line_size == (FILE *)0x0) {
    perror("file2");
    exit(1);
  }
  line_buf = (char *)0x0;
  local_38 = (char *)0x0;
  while( true ) {
    _Var1 = getline(&local_38,(size_t *)&line_buf,(FILE *)file2);
    if (_Var1 < 1) break;
    fprintf((FILE *)line_size,"%s",local_38);
  }
  free(local_38);
  return extraout_EAX;
}

Assistant:

void copy(const char *source, const char *dest) {
    FILE* file1 = fopen(source, "r");
    if(file1 == NULL){
        perror("file1");
        exit(EXIT_FAILURE);
    }
    FILE* file2 = fopen(dest, "wa");
    if(file2 == NULL){
        perror("file2");
        exit(EXIT_FAILURE);
    }
    size_t line_size=0;
    char* line_buf=0;
    while (getline(&line_buf, &line_size, file1) > 0) {
        fprintf(file2,"%s",line_buf);
    }
    free(line_buf);
    line_buf=NULL;
}